

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

Uint32 __thiscall Diligent::ThreadPoolImpl::GetRunningTaskCount(ThreadPoolImpl *this)

{
  ThreadPoolImpl *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (this->m_NumRunningTasks).super___atomic_base<int>._M_i;
}

Assistant:

GetRunningTaskCount() const override final
    {
        return m_NumRunningTasks.load();
    }